

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

QHttp2Stream * __thiscall
QHttp2ProtocolHandler::createNewStream
          (QHttp2ProtocolHandler *this,HttpMessagePair *message,bool uploadDone)

{
  QHttpNetworkReply *this_00;
  CreateStreamError CVar1;
  QHttp2Stream *p;
  QLoggingCategory *pQVar2;
  QDebug *pQVar3;
  QNonContiguousByteDevice *signal;
  char extraout_DL;
  anon_unknown_dwarf_6cb099 *this_01;
  long in_FS_OFFSET;
  Object local_c8 [12];
  CreateStreamError local_bc;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  char *local_70;
  QDebug local_60;
  undefined1 local_58 [8];
  QUrl streamKey;
  _Variadic_union<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (anon_unknown_dwarf_6cb099 *)&streamKey;
  streamKey.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_6cb099::urlkey_from_request(this_01,&message->first);
  p = QHttp2Connection::promisedStream(*(QHttp2Connection **)(this + 0x38),(QUrl *)this_01);
  if (p == (QHttp2Stream *)0x0) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (_Variadic_union<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>)
               QHttp2Connection::createStream
                         (*(QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> **)
                           (this + 0x38),(QHttp2Connection *)this_01);
    local_40 = (undefined1 *)CONCAT71(local_40._1_7_,extraout_DL);
    if (extraout_DL == '\0') {
      p = QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::unwrap
                    ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
                     &local_48._M_first);
      if (!uploadDone) {
        signal = QHttpNetworkRequest::uploadByteDevice(&message->first);
        if (signal != (QNonContiguousByteDevice *)0x0) {
          local_88.d._0_4_ = 0x1e075e;
          local_88.d._4_4_ = 0;
          local_88.ptr._0_4_ = 0;
          local_88.ptr._4_4_ = 0;
          QObject::connect<void(QObject::*)(QObject*),void(QHttp2ProtocolHandler::*)(QObject*)>
                    (local_c8,(offset_in_QObject_to_subr)signal,(ContextType *)QObject::destroyed,
                     (offset_in_QHttp2ProtocolHandler_to_subr *)0x0,(ConnectionType)this);
          QMetaObject::Connection::~Connection((Connection *)local_c8);
          local_a0.d = (Data *)signal;
          QPointer<QHttp2Stream>::QPointer<void>((QPointer<QHttp2Stream> *)&local_88,p);
          QHash<QObject*,QPointer<QHttp2Stream>>::emplace<QPointer<QHttp2Stream>const&>
                    ((QHash<QObject*,QPointer<QHttp2Stream>> *)(this + 0x48),(QObject **)&local_a0,
                     (QPointer<QHttp2Stream> *)&local_88);
          QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_88);
        }
      }
      local_88.d._0_4_ = 0x1f631e;
      local_88.d._4_4_ = 0;
      local_88.ptr._0_4_ = 0;
      local_88.ptr._4_4_ = 0;
      QMetaObject::invokeMethod<void(QHttpNetworkReply::*)()>
                (message->second,(offset_in_QHttpNetworkReply_to_subr *)&local_88,QueuedConnection);
      connectStream(this,message,p);
    }
    else {
      CVar1 = QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::error
                        ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
                         &local_48._M_first);
      if (CVar1 == MaxConcurrentStreamsReached) {
        p = (QHttp2Stream *)0x0;
      }
      else {
        pQVar2 = QtPrivateLogging::QT_HTTP2();
        if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_70 = pQVar2->name;
          local_88.d._0_4_ = 2;
          local_88.d._4_4_ = 0;
          local_88.ptr._0_4_ = 0;
          local_88.ptr._4_4_ = 0;
          local_88.size._0_4_ = 0;
          local_88.size._4_4_ = 0;
          QMessageLogger::debug();
          pQVar3 = QDebug::operator<<((QDebug *)&local_a0,"failed to create new stream:");
          local_60.stream = pQVar3->stream;
          *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
          QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::error
                    ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
                     &local_48._M_first);
          ::operator<<((Stream *)local_58,(CreateStreamError)&local_60);
          QDebug::~QDebug((QDebug *)local_58);
          QDebug::~QDebug(&local_60);
          QDebug::~QDebug((QDebug *)&local_a0);
        }
        this_00 = message->second;
        local_88.size._0_4_ = 0xaaaaaaaa;
        local_88.size._4_4_ = 0xaaaaaaaa;
        local_88.d._0_4_ = 0xaaaaaaaa;
        local_88.d._4_4_ = 0xaaaaaaaa;
        local_88.ptr._0_4_ = 0xaaaaaaaa;
        local_88.ptr._4_4_ = 0xaaaaaaaa;
        QCoreApplication::tr
                  ((QString *)&local_a0,"QHttp",
                   "Failed to initialize HTTP/2 stream with errorcode: %1",-1);
        local_bc = QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::error
                             ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
                              &local_48._M_first);
        QDebug::toString<QHttp2Connection::CreateStreamError>((QString *)&local_b8,&local_bc);
        p = (QHttp2Stream *)0x0;
        QString::arg<QString,_true>
                  ((QString *)&local_88,(QString *)&local_a0,(QString *)&local_b8,0,(QChar)0x20);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        QHttpNetworkReply::finishedWithError
                  ((QHttpNetworkReply *)this_00,ProtocolFailure,(QString *)&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      }
    }
  }
  QUrl::~QUrl(&streamKey);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return p;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Stream *QHttp2ProtocolHandler::createNewStream(const HttpMessagePair &message,
                                                     bool uploadDone)
{
    QUrl streamKey = urlkey_from_request(message.first);
    if (auto promisedStream = h2Connection->promisedStream(streamKey)) {
        Q_ASSERT(promisedStream->state() != QHttp2Stream::State::Closed);
        return promisedStream;
    }

    QH2Expected<QHttp2Stream *, QHttp2Connection::CreateStreamError>
            streamResult = h2Connection->createStream();
    if (!streamResult.ok()) {
        if (streamResult.error()
            == QHttp2Connection::CreateStreamError::MaxConcurrentStreamsReached) {
            // We have to wait for a stream to be closed before we can create a new one, so
            // we just return nullptr, the caller should not remove it from the queue.
            return nullptr;
        }
        qCDebug(QT_HTTP2) << "failed to create new stream:" << streamResult.error();
        auto *reply = message.second;
        const char *cstr = "Failed to initialize HTTP/2 stream with errorcode: %1";
        const QString errorString = QCoreApplication::tr("QHttp", cstr)
                                            .arg(QDebug::toString(streamResult.error()));
        emit reply->finishedWithError(QNetworkReply::ProtocolFailure, errorString);
        return nullptr;
    }
    QHttp2Stream *stream = streamResult.unwrap();

    if (!uploadDone) {
        if (auto *src = message.first.uploadByteDevice()) {
            connect(src, &QObject::destroyed, this, &QHttp2ProtocolHandler::_q_uploadDataDestroyed);
            streamIDs.insert(src, stream);
        }
    }

    auto *reply = message.second;
    QMetaObject::invokeMethod(reply, &QHttpNetworkReply::requestSent, Qt::QueuedConnection);

    connectStream(message, stream);
    return stream;
}